

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  FILE *__stream;
  _Alloc_hider _Var1;
  int in_ECX;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  Message errors;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  void *local_50 [2];
  string local_40;
  
  Message::Message((Message *)&local_58);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Attempted redefinition of test case ",0x24);
  if (test_case_name == (char *)0x0) {
    sVar5.ptr_ = local_58.ptr_ + 0x10;
    sVar2 = 6;
    pcVar3 = "(null)";
  }
  else {
    sVar5.ptr_ = local_58.ptr_;
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_58.ptr_ + 0x10);
    }
    sVar2 = strlen(test_case_name);
    pcVar3 = test_case_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,pcVar3,sVar2);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"All tests in the same test case must use the same test fixture\n",0x3f);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"class.  However, in test case ",0x1e);
  if (test_case_name == (char *)0x0) {
    sVar5.ptr_ = local_58.ptr_ + 0x10;
    sVar2 = 6;
    test_case_name = "(null)";
  }
  else {
    sVar5.ptr_ = local_58.ptr_;
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_58.ptr_ + 0x10);
    }
    sVar2 = strlen(test_case_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,test_case_name,sVar2);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", you tried\n",0xc);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"to define a test using a fixture class different from the one\n",0x3e);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"used earlier. This can happen if the two fixture classes are\n",0x3d);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"from different namespaces and have the same name. You should\n",0x3d);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"probably rename one of the classes to put the tests into different\n",0x43);
  poVar4 = (ostream *)(local_58.ptr_ + 0x10);
  if (local_58.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test cases.",0xb);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(&local_40,(internal *)file,(char *)(ulong)(uint)line,in_ECX);
  _Var1._M_p = local_40._M_dataplus._M_p;
  StringStreamToString((internal *)local_50,local_58.ptr_);
  fprintf(__stream,"%s %s",_Var1._M_p,local_50[0]);
  if (local_50[0] != (void *)0x0) {
    operator_delete__(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_58.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_58.ptr_ + 8))();
  }
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}